

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracyProfiler.cpp
# Opt level: O3

void __thiscall tracy::Profiler::SendCallstackPayload(Profiler *this,uint64_t _ptr)

{
  char *pcVar1;
  int iVar2;
  long lVar3;
  size_t __n;
  
  __n = *(long *)_ptr << 3;
  iVar2 = this->m_bufferOffset;
  if (0x40000 < (int)(((uint)__n & 0xffff) + (iVar2 - this->m_bufferStart) + 0xb)) {
    CommitData(this);
    iVar2 = this->m_bufferOffset;
  }
  pcVar1 = this->m_buffer;
  pcVar1[iVar2] = 'b';
  *(uint64_t *)(pcVar1 + (long)iVar2 + 1) = _ptr;
  iVar2 = this->m_bufferOffset;
  this->m_bufferOffset = iVar2 + 9;
  *(short *)(this->m_buffer + (long)iVar2 + 9) = (short)__n;
  lVar3 = (long)this->m_bufferOffset + 2;
  this->m_bufferOffset = (int)lVar3;
  memcpy(this->m_buffer + lVar3,(void *)(_ptr + 8),__n);
  this->m_bufferOffset = this->m_bufferOffset + (uint)__n;
  return;
}

Assistant:

void Profiler::SendCallstackPayload( uint64_t _ptr )
{
    auto ptr = (uintptr_t*)_ptr;

    QueueItem item;
    MemWrite( &item.hdr.type, QueueType::CallstackPayload );
    MemWrite( &item.stringTransfer.ptr, _ptr );

    const auto sz = *ptr++;
    const auto len = sz * sizeof( uint64_t );
    const auto l16 = uint16_t( len );

    NeedDataSize( QueueDataSize[(int)QueueType::CallstackPayload] + sizeof( l16 ) + l16 );

    AppendDataUnsafe( &item, QueueDataSize[(int)QueueType::CallstackPayload] );
    AppendDataUnsafe( &l16, sizeof( l16 ) );

    if( compile_time_condition<sizeof( uintptr_t ) == sizeof( uint64_t )>::value )
    {
        AppendDataUnsafe( ptr, sizeof( uint64_t ) * sz );
    }
    else
    {
        for( uintptr_t i=0; i<sz; i++ )
        {
            const auto val = uint64_t( *ptr++ );
            AppendDataUnsafe( &val, sizeof( uint64_t ) );
        }
    }
}